

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DPFSP.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _func_int **pp_Var1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  char cVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long *plVar12;
  ostream *poVar13;
  undefined8 uVar14;
  ulong uVar15;
  long *plVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  bool normalizzazione;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string percorso;
  string percorsoFile;
  Permutazione migliorIndividuo;
  string nomeReport;
  ADE_DEP_DPFSP adeDep;
  ofstream file;
  long local_368;
  double local_360;
  double local_358;
  ulong *local_350;
  long local_348;
  ulong local_340 [2];
  ulong *local_330;
  long local_328;
  ulong local_320 [2];
  long *local_310;
  long local_308;
  long local_300 [2];
  undefined1 *local_2f0;
  char *local_2e8;
  undefined1 local_2e0;
  undefined7 uStack_2df;
  Permutazione local_2d0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long local_298;
  long local_290;
  long local_288;
  ADE_DEP_DPFSP local_280;
  string local_250;
  _func_int **local_230;
  undefined8 local_228;
  _func_int *local_220;
  undefined8 uStack_218;
  ios_base local_138 [264];
  
  local_2f0 = &local_2e0;
  local_2e8 = (char *)0x0;
  local_2e0 = 0;
  local_358 = 0.0;
  local_360 = 1.2;
  lVar7 = 0;
  uVar19 = 0;
  uVar17 = 0;
  switch(argc) {
  case 1:
    goto switchD_0010360a_caseD_1;
  case 2:
    local_368._0_2_ = 100;
    lVar7 = 0x32;
    normalizzazione = false;
    goto LAB_0010392f;
  case 3:
    local_368 = 0x100064;
    normalizzazione = false;
    uVar17 = 0;
    goto LAB_00103885;
  case 4:
    normalizzazione = false;
    uVar17 = 0;
    goto LAB_001037d4;
  case 5:
    normalizzazione = false;
    goto LAB_001037c3;
  case 6:
    normalizzazione = false;
    uVar19 = 0;
    goto LAB_001037b2;
  case 7:
    goto switchD_0010360a_caseD_7;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,argv[7],(allocator<char> *)&local_310);
  pp_Var1 = local_230;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol((char *)pp_Var1,(char **)&local_280,10);
  if (local_280.super_ADE<Permutazione>._vptr_ADE == pp_Var1) {
    std::__throw_invalid_argument("stoi");
LAB_00104103:
    uVar14 = std::__throw_out_of_range("stoi");
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
    }
    _Unwind_Resume(uVar14);
  }
  if ((lVar7 - 0x80000000U < 0xffffffff00000000) || (*piVar6 == 0x22)) goto LAB_00104103;
  if (*piVar6 == 0) {
    *piVar6 = iVar2;
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,(ulong)(local_220 + 1));
  }
switchD_0010360a_caseD_7:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,argv[6],(allocator<char> *)&local_310);
  pp_Var1 = local_230;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  lVar8 = strtol((char *)pp_Var1,(char **)&local_280,10);
  if (local_280.super_ADE<Permutazione>._vptr_ADE == pp_Var1) {
LAB_001040a9:
    std::__throw_invalid_argument("stoi");
  }
  else if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar6 != 0x22)) {
    if (*piVar6 == 0) {
      *piVar6 = iVar2;
    }
    normalizzazione = (int)lVar8 != 0;
    uVar19 = (uint)lVar7;
    if (local_230 != &local_220) {
      operator_delete(local_230,(ulong)(local_220 + 1));
    }
LAB_001037b2:
    local_360 = strtod(argv[5],(char **)0x0);
LAB_001037c3:
    local_358 = strtod(argv[4],(char **)0x0);
    uVar17 = uVar19;
LAB_001037d4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,argv[3],(allocator<char> *)&local_310);
    pp_Var1 = local_230;
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    *piVar6 = 0;
    local_368 = strtol((char *)pp_Var1,(char **)&local_280,10);
    if (local_280.super_ADE<Permutazione>._vptr_ADE == pp_Var1) {
LAB_00104091:
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < local_368 - 0x80000000U) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar2;
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,(ulong)(local_220 + 1));
      }
LAB_00103885:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,argv[2],(allocator<char> *)&local_310);
      pp_Var1 = local_230;
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      *piVar6 = 0;
      lVar7 = strtol((char *)pp_Var1,(char **)&local_280,10);
      if (local_280.super_ADE<Permutazione>._vptr_ADE == pp_Var1) {
        std::__throw_invalid_argument("stoi");
      }
      else if ((0xfffffffeffffffff < lVar7 - 0x80000000U) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar2;
        }
        if (local_230 != &local_220) {
          operator_delete(local_230,(ulong)(local_220 + 1));
        }
LAB_0010392f:
        pcVar4 = local_2e8;
        pcVar18 = argv[1];
        strlen(pcVar18);
        std::__cxx11::string::_M_replace((ulong)&local_2f0,0,pcVar4,(ulong)pcVar18);
        lVar8 = std::chrono::_V2::system_clock::now();
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,local_2f0,local_2e8 + (long)local_2f0);
        ADE_DEP_DPFSP::ADE_DEP_DPFSP(&local_280,&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        ADE_DEP_DPFSP::esegui
                  (&local_2d0,&local_280,(unsigned_short)lVar7,(unsigned_short)local_368,local_358,
                   0.1,local_360,normalizzazione,uVar17);
        lVar9 = std::chrono::_V2::system_clock::now();
        std::__cxx11::string::find_last_of((char *)&local_2f0,0x10a060,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)&local_310,(ulong)&local_2f0);
        local_350 = local_340;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,local_310,local_308 + (long)local_310);
        local_298 = lVar9;
        local_290 = lVar8;
        local_288 = lVar7;
        std::__cxx11::string::append((char *)&local_350);
        uVar10 = std::chrono::_V2::system_clock::now();
        uVar20 = -uVar10;
        if (0 < (long)uVar10) {
          uVar20 = uVar10;
        }
        uVar17 = 1;
        if (9 < uVar20) {
          uVar15 = uVar20;
          uVar19 = 4;
          do {
            uVar17 = uVar19;
            if (uVar15 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00103af1;
            }
            if (uVar15 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00103af1;
            }
            if (uVar15 < 10000) goto LAB_00103af1;
            bVar3 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            uVar19 = uVar17 + 4;
          } while (bVar3);
          uVar17 = uVar17 + 1;
        }
LAB_00103af1:
        local_330 = local_320;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_330,(char)uVar17 - (char)((long)uVar10 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_330 - ((long)uVar10 >> 0x3f)),uVar17,uVar20);
        uVar20 = 0xf;
        if (local_350 != local_340) {
          uVar20 = local_340[0];
        }
        if (uVar20 < (ulong)(local_328 + local_348)) {
          uVar20 = 0xf;
          if (local_330 != local_320) {
            uVar20 = local_320[0];
          }
          if ((ulong)(local_328 + local_348) <= uVar20) {
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_330,0,(char *)0x0,(ulong)local_350);
            goto LAB_00103b7e;
          }
        }
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_330)
        ;
LAB_00103b7e:
        local_230 = &local_220;
        pp_Var1 = (_func_int **)(puVar11 + 2);
        if ((_func_int **)*puVar11 == pp_Var1) {
          local_220 = *pp_Var1;
          uStack_218 = puVar11[3];
        }
        else {
          local_220 = *pp_Var1;
          local_230 = (_func_int **)*puVar11;
        }
        local_228 = puVar11[1];
        *puVar11 = pp_Var1;
        puVar11[1] = 0;
        *(undefined1 *)pp_Var1 = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_230);
        plVar16 = plVar12 + 2;
        if ((long *)*plVar12 == plVar16) {
          local_2a8 = *plVar16;
          lStack_2a0 = plVar12[3];
          local_2b8 = &local_2a8;
        }
        else {
          local_2a8 = *plVar16;
          local_2b8 = (long *)*plVar12;
        }
        local_2b0 = plVar12[1];
        *plVar12 = (long)plVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if (local_230 != &local_220) {
          operator_delete(local_230,(ulong)(local_220 + 1));
        }
        if (local_330 != local_320) {
          operator_delete(local_330,local_320[0] + 1);
        }
        if (local_350 != local_340) {
          operator_delete(local_350,local_340[0] + 1);
        }
        std::ofstream::ofstream(&local_230,(string *)&local_2b8,_S_out);
        cVar5 = std::__basic_file<char>::is_open();
        if (cVar5 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,
                     "Fabbriche; Lavori; Macchine; Numero individui; Scala elaborazione; Theta; Fmax; Normalizzazione; Seed (0 se random); Durata (secondi); Miglior punteggio; Individuo;"
                     ,0xa4);
          std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
          std::ostream::put((char)&local_230);
          std::ostream::flush();
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<double>(local_358);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<double>(local_360);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          pcVar18 = "No";
          if (normalizzazione != false) {
            pcVar18 = "Si";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar18,2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,";",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<double>((double)(local_298 - local_290) / 1000000000.0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,";",1);
          if (local_2d0.dimensione != 0) {
            uVar20 = 0;
            do {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
              if ((int)uVar20 != local_2d0.dimensione - 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < local_2d0.dimensione);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,";",1);
          std::ios::widen((char)(ostream *)&local_230 + (char)local_230[-3]);
          std::ostream::put((char)&local_230);
          std::ostream::flush();
          std::ofstream::close();
        }
        local_230 = _VTT;
        *(undefined8 *)((long)&local_230 + (long)_VTT[-3]) = __filebuf;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_138);
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,local_2a8 + 1);
        }
        if (local_310 != local_300) {
          operator_delete(local_310,local_300[0] + 1);
        }
        Permutazione::~Permutazione(&local_2d0);
        local_280.super_ADE<Permutazione>._vptr_ADE = (_func_int **)&PTR_creaPopolazione_0010dc60;
        Istanza::~Istanza(&local_280.istanza);
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
        }
        return 0;
      }
      std::__throw_out_of_range("stoi");
      goto LAB_00104091;
    }
    std::__throw_out_of_range("stoi");
    goto LAB_001040a9;
  }
  std::__throw_out_of_range("stoi");
switchD_0010360a_caseD_1:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Devi inserire il percorso del file!",0x23);
  poVar13 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::endl<char,std::char_traits<char>>(poVar13);
  exit(-1);
}

Assistant:

int main(int argc, char* argv[])
{
	unsigned int seed = 0;
	unsigned short scalaElaborazione = 100;
	unsigned int nIndividui = 50;
	double theta = 0;
	double Fmax = 1.2;
	bool normalizzazione = false;
	string percorsoFile;

	size_t pos;

	switch (argc) {
		default:
		case 8:
			seed = stoi(argv[7], &pos);
		case 7:
			normalizzazione = stoi(argv[6], &pos);
		case 6:
			Fmax = strtod(argv[5], NULL);
		case 5:
			theta = strtod(argv[4], NULL);
		case 4:
			scalaElaborazione = stoi(argv[3], &pos);
		case 3:
			nIndividui = stoi(argv[2], &pos);
		case 2:
			percorsoFile = argv[1];
			break;
		case 1:
			cerr << "Devi inserire il percorso del file!" << endl << endl;
			exit(-1);
	}

	/*
	cout << endl << endl;
	cout << "Il programma sara' eseguito con queste impostazioni:" << endl << endl;
	cout << "Percorso file: " << percorsoFile << endl;
	cout << "Numero individui: " << nIndividui << endl;
	cout << "Scala elaborazione: " << scalaElaborazione << endl;
	cout << "Theta: " << theta << endl;
	cout << "F massimo: " << Fmax << endl;
	cout << "Normalizzazione attiva: " << (normalizzazione ? "Si" : "No") << endl;

	if(seed > 0) cout << "Seed: " << seed << endl;
	else cout << "Seed: " << "Random" << endl << endl;
	*/

	using orologio = std::chrono::system_clock;
	using sec = std::chrono::duration<double>;

	const auto tempoIniziale = orologio::now();


	//percorsoFile = "C:/users/edu4r/Desktop/DPFSP_Large/5/Ta016_5.txt";

	ADE_DEP_DPFSP adeDep(percorsoFile);
	Permutazione migliorIndividuo = adeDep.esegui(nIndividui, scalaElaborazione, theta, 0.1, Fmax, 
		normalizzazione, seed);

	const sec durata = orologio::now() - tempoIniziale;

	//Stampo a video le informazioni

	/*
	cout << "Risultati: " << endl << endl;
	cout << "Tempo speso: " << durata.count() << " secondi" << endl;
	cout << "Individuo: ";
	migliorIndividuo.stampa();
	cout << "Punteggio: " << migliorIndividuo.score << endl << endl;
	
	exit(0);
	*/
	

	//Salvo le informazioni su un CSV

	int posizione = percorsoFile.find_last_of(".");
	string percorso = percorsoFile.substr(0, posizione);

	string nomeReport = percorso + "_report-" + to_string(orologio::now().time_since_epoch().count()) + ".csv";

	ofstream file(nomeReport);
	
	if (file.is_open()) {
		file << "Fabbriche; Lavori; Macchine; Numero individui; Scala elaborazione; Theta; Fmax; Normalizzazione; Seed (0 se random); Durata (secondi); Miglior punteggio; Individuo;" << endl;

		file << adeDep.istanza.fabbriche << ";";
		file << adeDep.istanza.lavori << ";";
		file << adeDep.istanza.macchine << ";";
		file << nIndividui << ";";
		file << scalaElaborazione << ";";
		file << theta << ";";
		file << Fmax << ";";
		file << (normalizzazione ? "Si" : "No") << ";";
		file << seed << ";";
		file << durata.count() << ";";
		file << migliorIndividuo.score << ";";

		for (unsigned short i = 0; i < migliorIndividuo.dimensione; i++) {
			file << migliorIndividuo.individuo[i];
			if (i != migliorIndividuo.dimensione - 1) file << ",";
		}

		file << ";" << endl;

		file.close();
	}

	//cout << "Risultati salvati in: " << nomeReport << endl << endl;

	return 0;
}